

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_base.h
# Opt level: O1

string * __thiscall
test_uintwide_t_n_base::
hexlexical_cast<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<65536u,65536u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>>
          (string *__return_storage_ptr__,test_uintwide_t_n_base *this,
          number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
          *u)

{
  stringstream ss;
  stringstream asStack_198 [16];
  long local_188 [3];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(local_188[0] + -0x18)) & 0xffffffb5 | 8;
  boost::multiprecision::operator<<
            ((ostream *)local_188,
             (number<boost::multiprecision::backends::cpp_int_backend<24U,_24U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>
              *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

static auto hexlexical_cast(const UnsignedIntegralType& u) -> std::string
    {
      std::stringstream ss;

      ss << std::hex << u;

      return ss.str();
    }